

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O1

void duckdb::SQLLogicTestLogger::PrintErrorHeader
               (string *file_name,idx_t query_line,string *description)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  FILE *pFVar4;
  
  PrintLineSep();
  if (_stderr == (FILE *)0x0) {
LAB_00475bf5:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5e7ff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00475c37;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00475bf5;
LAB_00475c37:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[31m",5);
  }
  if (_stderr == (FILE *)0x0) {
LAB_00475c68:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5e7ff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00475caa;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00475c68;
LAB_00475caa:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m",4);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(description->_M_dataplus)._M_p,
                      description->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pFVar4 = _stdout;
  if (poVar3 != (ostream *)&std::cout) {
    pFVar4 = (FILE *)0x0;
    if (poVar3 == (ostream *)&std::clog) {
      pFVar4 = _stderr;
    }
    if (poVar3 == (ostream *)&std::cerr) {
      pFVar4 = _stderr;
    }
  }
  if (pFVar4 == (FILE *)0x0) {
LAB_00475d35:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00475d74;
  }
  else {
    iVar1 = fileno(pFVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00475d35;
LAB_00475d74:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
  }
  if (file_name->_M_string_length == 0) goto LAB_00475efa;
  if (_stderr == (FILE *)0x0) {
LAB_00475dac:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5e7ff8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00475de8;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00475dac;
LAB_00475de8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(file_name->_M_dataplus)._M_p,
                      file_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")!",2);
  pFVar4 = _stdout;
  if (poVar3 != (ostream *)&std::cout) {
    pFVar4 = (FILE *)0x0;
    if (poVar3 == (ostream *)&std::clog) {
      pFVar4 = _stderr;
    }
    if (poVar3 == (ostream *)&std::cerr) {
      pFVar4 = _stderr;
    }
  }
  if (pFVar4 == (FILE *)0x0) {
LAB_00475ea9:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) == 0) goto LAB_00475efa;
  }
  else {
    iVar1 = fileno(pFVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00475ea9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
LAB_00475efa:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void SQLLogicTestLogger::PrintErrorHeader(const string &file_name, idx_t query_line, const string &description) {
	PrintLineSep();
	std::cerr << termcolor::red << termcolor::bold << description << " " << termcolor::reset;
	if (!file_name.empty()) {
		std::cerr << termcolor::bold << "(" << file_name << ":" << query_line << ")!" << termcolor::reset;
	}
	std::cerr << std::endl;
}